

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

void temperature_monitor(void)

{
  pal_result pVar1;
  pal_led_color color;
  int iVar2;
  float fVar3;
  unsigned_short t;
  unsigned_short local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  iVar2 = 3;
  do {
    pVar1 = pal_temperature_get(&local_2a);
    if (pVar1 == PAL_ERROR_ARG) {
      pal_halt();
    }
    else if (pVar1 == PAL_OK) {
      fVar3 = pal_temperature_to_celsius(local_2a);
      local_28 = CONCAT44(local_28._4_4_,(float)local_28 + fVar3);
    }
    if (iVar2 == 1) break;
    pal_sleep(1000);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (pVar1 == PAL_OK) {
    fVar3 = (float)local_28 / 3.0;
    if (fVar3 <= 120.0) {
      local_28 = CONCAT44(local_28._4_4_,fVar3);
      color = -(uint)(fVar3 < -10.0 || 60.0 < fVar3) & PAL_LED_RED ^ PAL_LED_GREEN;
      if (fVar3 < -38.0) {
        color = PAL_LED_RED;
      }
      if (80.0 < fVar3) {
        color = PAL_LED_RED;
      }
      pal_led_set_color(color);
      pal_fan_set_speed((int)((float)local_28 * 10.0));
      return;
    }
    pal_led_set_color(PAL_LED_RED);
    pal_fan_set_speed(0);
  }
  else {
    pal_led_set_color(PAL_LED_RED);
  }
  pal_halt();
  return;
}

Assistant:

void temperature_monitor(void) {
    unsigned short t;
    float t_c = 0.0;
    pal_result result = PAL_ERROR_ARG;
    for (int i = 0; i < NUMBER_SAMPLES; i++)
    {
        result = pal_temperature_get(&t);
        if (result == PAL_OK) {
            t_c += pal_temperature_to_celsius(t);
        }
        else if (result == PAL_ERROR_ARG) {
            pal_halt();
        }

        if ((i + 1) < NUMBER_SAMPLES)
            pal_sleep(SAMPLE_INTERVAL);
    }

    t_c /= (float)NUMBER_SAMPLES;

    if (result == PAL_OK)
    {
        if (t_c > 120.0) {
            pal_led_set_color(PAL_LED_RED);
            pal_fan_set_speed((int)(0.0f));
            pal_halt();
            t_c = 0;
        }
        else {
            if ((t_c > 80.0) || (t_c < -38.0)) {
                pal_led_set_color(PAL_LED_RED);
            }
            else if ((t_c > 60.0) || (t_c < -10.0)) {
                pal_led_set_color(PAL_LED_YELLOW);
            }
            else {
                pal_led_set_color(PAL_LED_GREEN);
            }
            pal_fan_set_speed((int)(t_c * 10.0f));
        }
    }
    else {
        pal_led_set_color(PAL_LED_RED);
        pal_halt();
    }
}